

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_vxc_helper_unpolar<ExchCXX::BuiltinFT98_X>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  long lVar1;
  double dVar2;
  double sigma_00;
  double tau_00;
  double dVar3;
  double local_38;
  
  if (0 < N) {
    lVar1 = 0;
    do {
      dVar2 = *(double *)((long)rho + lVar1);
      if (dVar2 <= 1e-12) {
        *(double *)(lVar1 + (long)eps) = 0.0;
        *(double *)((long)vrho + lVar1) = 0.0;
        *(double *)((long)vsigma + lVar1) = 0.0;
        *(double *)((long)vtau + lVar1) = 0.0;
        dVar2 = 0.0;
      }
      else {
        dVar3 = 1.0000000000000042e-32;
        if (1.0000000000000042e-32 <= *(double *)((long)sigma + lVar1)) {
          dVar3 = *(double *)((long)sigma + lVar1);
        }
        tau_00 = 1e-20;
        if (1e-20 <= *(double *)((long)tau + lVar1)) {
          tau_00 = *(double *)((long)tau + lVar1);
        }
        sigma_00 = dVar2 * 8.0 * tau_00;
        if (dVar3 <= sigma_00) {
          sigma_00 = dVar3;
        }
        kernel_traits<ExchCXX::BuiltinFT98_X>::eval_exc_vxc_unpolar_impl
                  (dVar2,sigma_00,*(double *)((long)lapl + lVar1),tau_00,
                   (double *)(lVar1 + (long)eps),(double *)((long)vrho + lVar1),
                   (double *)((long)vsigma + lVar1),&local_38,(double *)((long)vtau + lVar1));
        dVar2 = local_38;
      }
      *(double *)((long)vlapl + lVar1) = dVar2;
      lVar1 = lVar1 + 8;
    } while ((ulong)(uint)N << 3 != lVar1);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_GENERATOR( host_eval_exc_vxc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const auto lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    double vl;
    traits::eval_exc_vxc_unpolar( rho[i], sigma[i], lapl_i, tau[i],
      eps[i], vrho[i], vsigma[i], vl, vtau[i] );
    if(traits::needs_laplacian) vlapl[i] = vl;

  }

}